

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileImporter::CreateDataFromImport(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  undefined4 uVar1;
  Object *pOVar2;
  pointer paVar3;
  pointer ppaVar4;
  _Head_base<0UL,_aiMesh_*,_false> _Var5;
  aiNode *this_00;
  aiNode **ppaVar6;
  pointer ppOVar7;
  aiMesh **ppaVar8;
  aiMesh *paVar9;
  aiVector3D *paVar10;
  aiColor4D *paVar11;
  uint *puVar12;
  runtime_error *prVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  pointer ppaVar20;
  ulong uVar21;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_88;
  pointer local_68;
  ulong local_60;
  _Head_base<0UL,_aiMesh_*,_false> local_58;
  aiColor4D **local_50;
  ulong local_48;
  ulong local_40;
  aiVector3D **local_38;
  
  if (pModel != (Model *)0x0) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar19 = (pModel->m_ModelName)._M_string_length;
    if (uVar19 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0xaf,
                    "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                   );
    }
    if (uVar19 < 0x400) {
      (this_00->mName).length = (ai_uint32)uVar19;
      memcpy((this_00->mName).data,(pModel->m_ModelName)._M_dataplus._M_p,uVar19);
      (this_00->mName).data[uVar19] = '\0';
    }
    ppOVar7 = (pModel->m_Objects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)(pModel->m_Objects).
                   super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7;
    if (lVar14 == 0) {
      local_68 = (pModel->m_Vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
      paVar3 = (pModel->m_Vertices).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_68 != paVar3) {
        paVar9 = (aiMesh *)operator_new(0x520);
        paVar9->mNumFaces = 0;
        local_38 = &paVar9->mVertices;
        memset(local_38,0,0xcc);
        paVar9->mBones = (aiBone **)0x0;
        paVar9->mMaterialIndex = 0;
        (paVar9->mName).length = 0;
        (paVar9->mName).data[0] = '\0';
        memset((paVar9->mName).data + 1,0x1b,0x3ff);
        paVar9->mNumAnimMeshes = 0;
        paVar9->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar9->mMethod = 0;
        (paVar9->mAABB).mMin.x = 0.0;
        (paVar9->mAABB).mMin.y = 0.0;
        (paVar9->mAABB).mMin.z = 0.0;
        (paVar9->mAABB).mMax.x = 0.0;
        (paVar9->mAABB).mMax.y = 0.0;
        (paVar9->mAABB).mMax.z = 0.0;
        local_50 = paVar9->mColors;
        memset(local_50,0,0xa0);
        paVar9->mPrimitiveTypes = 1;
        local_48 = ((long)paVar3 - (long)local_68 >> 2) * -0x5555555555555555;
        paVar9->mNumVertices = (uint)local_48;
        uVar17 = local_48 & 0xffffffff;
        local_60 = uVar17 * 0xc;
        local_58._M_head_impl = paVar9;
        paVar10 = (aiVector3D *)operator_new__(local_60);
        uVar19 = local_60;
        local_40 = uVar17;
        if (uVar17 != 0) {
          memset(paVar10,0,((local_60 - 0xc) / 0xc) * 0xc + 0xc);
        }
        *local_38 = paVar10;
        memcpy(paVar10,local_68,uVar19);
        local_68 = (pModel->m_Normals).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        paVar3 = (pModel->m_Normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (local_68 != paVar3) {
          paVar10 = (aiVector3D *)operator_new__(uVar19);
          if (local_40 != 0) {
            memset(paVar10,0,((local_60 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar9->mNormals = paVar10;
          if ((ulong)(((long)paVar3 - (long)local_68 >> 2) * -0x5555555555555555) < local_40) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)&local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_88,"OBJ: vertex normal index out of range","");
            std::runtime_error::runtime_error(prVar13,(string *)&local_88);
            *(undefined ***)prVar13 = &PTR__runtime_error_0080bf48;
            __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          memcpy(paVar10,local_68,local_60);
        }
        if ((pModel->m_VertexColors).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pModel->m_VertexColors).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar19 = local_48 & 0xffffffff;
          uVar17 = uVar19 << 4;
          paVar11 = (aiColor4D *)operator_new__(uVar17);
          if ((int)local_48 == 0) {
            *local_50 = paVar11;
          }
          else {
            uVar21 = 0;
            memset(paVar11,0,uVar17);
            *local_50 = paVar11;
            lVar14 = 0xc;
            lVar15 = 8;
            do {
              paVar3 = (pModel->m_VertexColors).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar17 = ((long)(pModel->m_VertexColors).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 2) *
                       -0x5555555555555555;
              if (uVar17 < uVar21 || uVar17 - uVar21 == 0) {
                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_88,"OBJ: vertex color index out of range","");
                std::runtime_error::runtime_error(prVar13,(string *)&local_88);
                *(undefined ***)prVar13 = &PTR__runtime_error_0080bf48;
                __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              uVar1 = *(undefined4 *)((long)&paVar3->x + lVar15);
              paVar11 = (local_58._M_head_impl)->mColors[0];
              *(undefined8 *)((long)paVar11 + lVar14 + -0xc) =
                   *(undefined8 *)((long)paVar3 + lVar15 + -8);
              *(undefined4 *)((long)paVar11 + lVar14 + -4) = uVar1;
              *(undefined4 *)((long)&paVar11->r + lVar14) = 0x3f800000;
              uVar21 = uVar21 + 1;
              lVar14 = lVar14 + 0x10;
              lVar15 = lVar15 + 0xc;
            } while (uVar19 != uVar21);
            this_00 = pScene->mRootNode;
          }
        }
        this_00->mNumMeshes = 1;
        puVar12 = (uint *)operator_new__(4);
        pScene->mRootNode->mMeshes = puVar12;
        *pScene->mRootNode->mMeshes = 0;
        ppaVar8 = (aiMesh **)operator_new__(8);
        _Var5._M_head_impl = local_58._M_head_impl;
        pScene->mMeshes = ppaVar8;
        pScene->mNumMeshes = 1;
        local_58._M_head_impl = (aiMesh *)0x0;
        *ppaVar8 = _Var5._M_head_impl;
        std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
                  ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_58);
      }
    }
    else {
      lVar14 = lVar14 >> 3;
      lVar15 = 0;
      uVar16 = 0;
      uVar18 = 0;
      do {
        pOVar2 = ppOVar7[lVar15];
        if (pOVar2 != (Object *)0x0) {
          uVar16 = uVar16 + 1;
          uVar18 = uVar18 + (int)((ulong)((long)*(pointer *)
                                                 ((long)&(pOVar2->m_Meshes).
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(pOVar2->m_Meshes).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2);
        }
        lVar15 = lVar15 + 1;
      } while (lVar14 + (ulong)(lVar14 == 0) != lVar15);
      ppaVar6 = (aiNode **)operator_new__((ulong)uVar16 << 3);
      this_00->mChildren = ppaVar6;
      local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_88,(ulong)uVar18);
      ppOVar7 = (pModel->m_Objects).
                super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pModel->m_Objects).
          super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppOVar7) {
        uVar19 = 0;
        do {
          createNodes(this,pModel,ppOVar7[uVar19],pScene->mRootNode,pScene,&local_88);
          uVar19 = uVar19 + 1;
          ppOVar7 = (pModel->m_Objects).
                    super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar19 < (ulong)((long)(pModel->m_Objects).
                                        super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar7
                                 >> 3));
      }
      ppaVar4 = local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppaVar20 = local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (pScene->mRootNode->mNumChildren != uVar16) {
        __assert_fail("pScene->mRootNode->mNumChildren == childCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                      ,200,
                      "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                     );
      }
      if (pScene->mNumMeshes != 0) {
        uVar19 = 0xffffffffffffffff;
        if (-1 < (long)local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          uVar19 = (long)local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        ppaVar8 = (aiMesh **)operator_new__(uVar19);
        pScene->mMeshes = ppaVar8;
        if (ppaVar4 != ppaVar20) {
          uVar19 = 0;
          do {
            pScene->mMeshes[uVar19] = ppaVar20[uVar19];
            uVar19 = uVar19 + 1;
            ppaVar20 = local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
          } while (uVar19 < (ulong)((long)local_88.
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_88.
                                          super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      createMaterials(this,pModel,pScene);
      if (local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void ObjFileImporter::CreateDataFromImport(const ObjFile::Model* pModel, aiScene* pScene) {
    if( 0L == pModel ) {
        return;
    }

    // Create the root node of the scene
    pScene->mRootNode = new aiNode;
    if ( !pModel->m_ModelName.empty() ) {
        // Set the name of the scene
        pScene->mRootNode->mName.Set(pModel->m_ModelName);
    } else {
        // This is a fatal error, so break down the application
        ai_assert(false);
    }

    if (pModel->m_Objects.size() > 0) {

        unsigned int meshCount = 0;
        unsigned int childCount = 0;

        for(size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            if(pModel->m_Objects[index]) {
                ++childCount;
                meshCount += (unsigned int)pModel->m_Objects[index]->m_Meshes.size();
            }
        }

        // Allocate space for the child nodes on the root node
        pScene->mRootNode->mChildren = new aiNode*[ childCount ];

        // Create nodes for the whole scene
        std::vector<aiMesh*> MeshArray;
        MeshArray.reserve(meshCount);
        for (size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            createNodes(pModel, pModel->m_Objects[index], pScene->mRootNode, pScene, MeshArray);
        }

        ai_assert(pScene->mRootNode->mNumChildren == childCount);

        // Create mesh pointer buffer for this scene
        if (pScene->mNumMeshes > 0) {
            pScene->mMeshes = new aiMesh*[MeshArray.size()];
            for (size_t index = 0; index < MeshArray.size(); ++index) {
                pScene->mMeshes[index] = MeshArray[index];
            }
        }

        // Create all materials
        createMaterials(pModel, pScene);
    }else {
		if (pModel->m_Vertices.empty()){
			return;
		}

		std::unique_ptr<aiMesh> mesh( new aiMesh );
        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        unsigned int n = (unsigned int)pModel->m_Vertices.size();
        mesh->mNumVertices = n;

        mesh->mVertices = new aiVector3D[n];
        memcpy(mesh->mVertices, pModel->m_Vertices.data(), n*sizeof(aiVector3D) );

        if ( !pModel->m_Normals.empty() ) {
            mesh->mNormals = new aiVector3D[n];
            if (pModel->m_Normals.size() < n) {
                throw DeadlyImportError("OBJ: vertex normal index out of range");
            }
            memcpy(mesh->mNormals, pModel->m_Normals.data(), n*sizeof(aiVector3D));
        }

        if ( !pModel->m_VertexColors.empty() ){
            mesh->mColors[0] = new aiColor4D[mesh->mNumVertices];
            for (unsigned int i = 0; i < n; ++i) {
                if (i < pModel->m_VertexColors.size() ) {
                    const aiVector3D& color = pModel->m_VertexColors[i];
                    mesh->mColors[0][i] = aiColor4D(color.x, color.y, color.z, 1.0);
                }else {
                    throw DeadlyImportError("OBJ: vertex color index out of range");
                }
            }
        }

        pScene->mRootNode->mNumMeshes = 1;
        pScene->mRootNode->mMeshes = new unsigned int[1];
        pScene->mRootNode->mMeshes[0] = 0;
        pScene->mMeshes = new aiMesh*[1];
        pScene->mNumMeshes = 1;
        pScene->mMeshes[0] = mesh.release();
    }
}